

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

bool libcellml::isEuropeanNumericCharacter(char c)

{
  _Rb_tree_header *p_Var1;
  undefined1 uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  initializer_list<char> __l;
  set<char,_std::less<char>,_std::allocator<char>_> validIntegerCharacters;
  allocator_type local_52;
  less<char> local_51;
  char local_50 [16];
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_40;
  
  builtin_strncpy(local_50,"0123456789",10);
  __l._M_len = 10;
  __l._M_array = local_50;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)&local_40,__l,&local_51,&local_52)
  ;
  p_Var1 = &local_40._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  p_Var6 = &p_Var1->_M_header;
  if (local_40._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    do {
      p_Var3 = local_40._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = p_Var5;
      uVar2 = (undefined1)p_Var3[1]._M_color;
      p_Var5 = p_Var3;
      if ((char)uVar2 < c) {
        p_Var5 = p_Var4;
      }
      local_40._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&p_Var3->_M_left)[(char)uVar2 < c];
    } while ((&p_Var3->_M_left)[(char)uVar2 < c] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      if ((char)uVar2 < c) {
        p_Var3 = p_Var4;
      }
      p_Var6 = p_Var5;
      if (c < (char)p_Var3[1]._M_color) {
        p_Var6 = &p_Var1->_M_header;
      }
    }
  }
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_40);
  return (_Rb_tree_header *)p_Var6 != p_Var1;
}

Assistant:

bool isEuropeanNumericCharacter(char c)
{
    const std::set<char> validIntegerCharacters = {'0', '1', '2', '3', '4', '5', '6', '7', '8', '9'};
    return validIntegerCharacters.find(c) != validIntegerCharacters.end();
}